

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# understandLayerFactory.cpp
# Opt level: O2

void understandLayerFactory(void)

{
  ostream *poVar1;
  vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> types_;
  ShoesParameter p4;
  ShoesParameter p3;
  ShoesParameter p2;
  ShoesParameter p1;
  shared_ptr<Shoes> sStack_158;
  vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_> local_148;
  undefined1 local_128 [72];
  undefined1 local_e0 [72];
  undefined1 local_98 [72];
  undefined1 local_50 [72];
  
  std::__cxx11::string::string((string *)local_50,"red",(allocator *)local_98);
  local_50._32_4_ = 0x2a;
  std::__cxx11::string::string((string *)(local_50 + 0x28),"Nike",(allocator *)local_e0);
  std::__cxx11::string::string((string *)local_98,"yellow",(allocator *)local_e0);
  local_98._32_4_ = 0x2a;
  std::__cxx11::string::string((string *)(local_98 + 0x28),"Nike",(allocator *)local_128);
  std::__cxx11::string::string((string *)local_e0,"red",(allocator *)local_128);
  local_e0._32_4_ = 0x2a;
  std::__cxx11::string::string((string *)(local_e0 + 0x28),"Adidas",(allocator *)&local_148);
  std::__cxx11::string::string((string *)local_128,"red",(allocator *)&local_148);
  local_128._32_4_ = 0x2a;
  std::__cxx11::string::string((string *)(local_128 + 0x28),"Tmp",(allocator *)&sStack_158);
  local_148.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ProductRegistry::CreateLayer((ProductRegistry *)&sStack_158,(ShoesParameter *)local_50);
  std::vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>>::
  emplace_back<std::shared_ptr<Shoes>>
            ((vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>> *)&local_148,
             &sStack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_158.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*(((local_148.
       super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>._M_impl.
       super__Vector_impl_data._M_start)->super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>).
    _M_ptr)->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProductRegistry::CreateLayer((ProductRegistry *)&sStack_158,(ShoesParameter *)local_98);
  std::vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>>::
  emplace_back<std::shared_ptr<Shoes>>
            ((vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>> *)&local_148,
             &sStack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_158.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*(local_148.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
     _M_impl.super__Vector_impl_data._M_start[1].
     super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProductRegistry::CreateLayer((ProductRegistry *)&sStack_158,(ShoesParameter *)local_e0);
  std::vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>>::
  emplace_back<std::shared_ptr<Shoes>>
            ((vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>> *)&local_148,
             &sStack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_158.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*(local_148.super__Vector_base<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>.
     _M_impl.super__Vector_impl_data._M_start[2].
     super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_Shoes[2])();
  poVar1 = std::operator<<((ostream *)&std::cout,"===========================");
  std::endl<char,std::char_traits<char>>(poVar1);
  ProductRegistry::CreateLayer((ProductRegistry *)&sStack_158,(ShoesParameter *)local_128);
  std::vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>>::
  emplace_back<std::shared_ptr<Shoes>>
            ((vector<std::shared_ptr<Shoes>,std::allocator<std::shared_ptr<Shoes>>> *)&local_148,
             &sStack_158);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_158.super___shared_ptr<Shoes,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::vector<std::shared_ptr<Shoes>,_std::allocator<std::shared_ptr<Shoes>_>_>::~vector(&local_148)
  ;
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_128);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_e0);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_98);
  ShoesParameter::~ShoesParameter((ShoesParameter *)local_50);
  return;
}

Assistant:

void understandLayerFactory()
{
    // 构造
    ShoesParameter p1 = {"red", 42, "Nike"};
    ShoesParameter p2 = {"yellow", 42, "Nike"};
    ShoesParameter p3 = {"red", 42, "Adidas"};
    ShoesParameter p4 = {"red", 42, "Tmp"};

    vector<shared_ptr<Shoes>> types_;

    types_.push_back(ProductRegistry::CreateLayer(p1));
    cout<<"==========================="<<endl;
    types_[0]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p2));
    cout<<"==========================="<<endl;
    types_[1]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p3));
    cout<<"==========================="<<endl;
    types_[2]->Show();
    cout<<"==========================="<<endl;
    types_.push_back(ProductRegistry::CreateLayer(p4));

}